

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O2

void pzgeom::TPZGeoQuad::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *pTVar4;
  long lVar5;
  TPZManVector<double,_3> co;
  int64_t index;
  TPZManVector<long,_4> nodeindexes;
  
  TPZManVector<long,_4>::TPZManVector(&nodeindexes,4);
  TPZManVector<double,_3>::TPZManVector(&co,lowercorner);
  pdVar1 = size->fStore;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    co.super_TPZVec<double>.fStore[lVar5] =
         pdVar1[lVar5] * 0.2 + co.super_TPZVec<double>.fStore[lVar5];
  }
  this = &gmesh->fNodeVec;
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  *nodeindexes.super_TPZVec<long>.fStore = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&co.super_TPZVec<double>,gmesh);
  *co.super_TPZVec<double>.fStore = *size->fStore * 0.6 + *co.super_TPZVec<double>.fStore;
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  nodeindexes.super_TPZVec<long>.fStore[1] = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&co.super_TPZVec<double>,gmesh);
  pdVar1 = size->fStore;
  co.super_TPZVec<double>.fStore[1] = *pdVar1 * 0.6 + co.super_TPZVec<double>.fStore[1];
  *co.super_TPZVec<double>.fStore = *pdVar1 * 0.1 + *co.super_TPZVec<double>.fStore;
  co.super_TPZVec<double>.fStore[2] = *pdVar1 * 0.3 + co.super_TPZVec<double>.fStore[2];
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  nodeindexes.super_TPZVec<long>.fStore[2] = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&co.super_TPZVec<double>,gmesh);
  pdVar1 = lowercorner->fStore;
  pdVar2 = size->fStore;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    co.super_TPZVec<double>.fStore[lVar5] = pdVar2[lVar5] * 0.2 + pdVar1[lVar5];
  }
  co.super_TPZVec<double>.fStore[1] = pdVar2[1] * 0.4 + co.super_TPZVec<double>.fStore[1];
  co.super_TPZVec<double>.fStore[2] = pdVar2[2] * -0.2 + co.super_TPZVec<double>.fStore[2];
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  nodeindexes.super_TPZVec<long>.fStore[3] = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&co.super_TPZVec<double>,gmesh);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])(gmesh,3,&nodeindexes,matid,&index,1);
  TPZManVector<double,_3>::~TPZManVector(&co);
  TPZManVector<long,_4>::~TPZManVector(&nodeindexes);
  return;
}

Assistant:

void TPZGeoQuad::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<int64_t,4> nodeindexes(4);
        TPZManVector<REAL,3> co(lowercorner);
        for (int i=0; i<3; i++) {
            co[i] += 0.2*size[i];
        }

        nodeindexes[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[0]].Initialize(co, gmesh);
        co[0] += 0.6 * size[0];
        nodeindexes[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[1]].Initialize(co, gmesh);
        co[1] += 0.6 * size[0];
        co[0] += 0.1 * size[0];
        co[2] += 0.3 * size[0];
        nodeindexes[2] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[2]].Initialize(co, gmesh);
        for (int i = 0; i < 3; i++) co[i] = lowercorner[i] + 0.2 * size[i];
        co[1] += 0.4 * size[1];
        co[2] -= 0.2 * size[2];
        nodeindexes[3] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[3]].Initialize(co, gmesh);
        int64_t index;
        gmesh.CreateGeoElement(EQuadrilateral, nodeindexes, matid, index);
    }